

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O2

string * __thiscall
OpenMD::StringTokenizer::getRemainingString_abi_cxx11_
          (string *__return_storage_ptr__,StringTokenizer *this)

{
  value_type *__value;
  insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  insertIter;
  insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  local_30.iter._M_current = (char *)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = local_30.iter._M_current;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __value = (this->currentPos_)._M_current;
  if ((this->end_)._M_current != __value) {
    local_30.container = __return_storage_ptr__;
    for (; __value != (this->end_)._M_current; __value = __value + 1) {
      std::
      insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=(&local_30,__value);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringTokenizer::getRemainingString() const {
    std::string result;
    std::string::const_iterator tmpIter = currentPos_;
    if (tmpIter != end_) {
      std::insert_iterator<std::string> insertIter(result, result.begin());

      while (tmpIter != end_) {
        *insertIter++ = *tmpIter++;
      }
    }

    return result;
  }